

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void adjustlocalvars(LexState *ls,int nvars)

{
  byte bVar1;
  FuncState *fs_00;
  int iVar2;
  Vardesc *pVVar3;
  Vardesc *var;
  int local_28;
  int vidx;
  int i;
  int reglevel;
  FuncState *fs;
  int nvars_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  vidx = luaY_nvarstack(fs_00);
  for (local_28 = 0; local_28 < nvars; local_28 = local_28 + 1) {
    bVar1 = fs_00->nactvar;
    fs_00->nactvar = bVar1 + 1;
    pVVar3 = getlocalvardesc(fs_00,(uint)bVar1);
    (pVVar3->vd).ridx = (lu_byte)vidx;
    iVar2 = registerlocalvar(ls,fs_00,(pVVar3->vd).name);
    (pVVar3->vd).pidx = (short)iVar2;
    vidx = vidx + 1;
  }
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  int reglevel = luaY_nvarstack(fs);
  int i;
  for (i = 0; i < nvars; i++) {
    int vidx = fs->nactvar++;
    Vardesc *var = getlocalvardesc(fs, vidx);
    var->vd.ridx = reglevel++;
    var->vd.pidx = registerlocalvar(ls, fs, var->vd.name);
  }
}